

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<double> fmt::v11::detail::dragonbox::shorter_interval_case<double>(int exponent)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint128_fallback uVar11;
  decimal_fp<double> dVar12;
  
  if (0x1721 < exponent + 0xba9U) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                ,0xd3,"too large exponent");
  }
  iVar5 = exponent * 0x9a209 + -0x3fe1f >> 0x15;
  cVar6 = (char)(iVar5 * -0x1a934f >> 0x13) + (char)exponent;
  uVar11 = cache_accessor<double>::get_cached_power(-iVar5);
  uVar4 = uVar11.hi_;
  bVar3 = 0xb - cVar6;
  uVar9 = (uVar4 >> 0x35) + uVar4 >> (bVar3 & 0x3f);
  uVar10 = (ulong)((exponent & 0xfffffffeU) != 2) + (uVar4 - (uVar4 >> 0x36) >> (bVar3 & 0x3f));
  uVar7 = uVar9 / 10;
  if (uVar7 * 10 < uVar10) {
    uVar9 = (uVar4 >> (10U - cVar6 & 0x3f)) + 1 >> 1;
    if (exponent == -0x4d) {
      uVar9 = uVar9 & 0xfffffffffffffffe;
    }
    else {
      uVar9 = uVar9 + (uVar9 < uVar10);
    }
  }
  else {
    if (uVar9 < 10) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                  ,0x497,"");
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    if (SUB168(auVar1 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar1 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar7 = uVar7 / 100000000;
      if ((int)uVar7 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/format-inl.h"
                    ,0x482,"");
      }
      uVar4 = uVar7 & 0xffffffff;
      uVar2 = 8;
      while( true ) {
        uVar8 = (int)uVar4 * 0x40000000 | (uint)((int)uVar4 * -0x3d70a3d7) >> 2;
        if (0x28f5c28 < uVar8) break;
        uVar7 = (ulong)uVar8;
        uVar4 = (ulong)uVar8;
        uVar2 = uVar2 + 2;
      }
      uVar8 = (int)uVar7 * -0x33333333;
      uVar8 = uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f;
      uVar9 = (ulong)uVar8;
      if (uVar8 >= 0x1999999a) {
        uVar9 = uVar7 & 0xffffffff;
      }
      uVar2 = uVar2 | uVar8 < 0x1999999a;
    }
    else {
      uVar8 = 0;
      do {
        uVar2 = uVar8;
        uVar4 = uVar7;
        uVar7 = uVar4 * -0x70a3d70a3d70a3d7 >> 2 | uVar4 << 0x3e;
        uVar8 = uVar2 + 2;
      } while (uVar7 < 0x28f5c28f5c28f5d);
      uVar7 = uVar4 * -0x3333333333333333 >> 1 | uVar4 << 0x3f;
      uVar9 = uVar7;
      if (uVar7 >= 0x199999999999999a) {
        uVar9 = uVar4;
      }
      uVar2 = uVar2 | uVar7 < 0x199999999999999a;
    }
    iVar5 = iVar5 + 1 + uVar2;
  }
  dVar12.exponent = iVar5;
  dVar12.significand = uVar9;
  dVar12._12_4_ = 0;
  return dVar12;
}

Assistant:

FMT_INLINE decimal_fp<T> shorter_interval_case(int exponent) noexcept {
  decimal_fp<T> ret_value;
  // Compute k and beta
  const int minus_k = floor_log10_pow2_minus_log10_4_over_3(exponent);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute xi and zi
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);

  auto xi = cache_accessor<T>::compute_left_endpoint_for_shorter_interval_case(
      cache, beta);
  auto zi = cache_accessor<T>::compute_right_endpoint_for_shorter_interval_case(
      cache, beta);

  // If the left endpoint is not an integer, increase it
  if (!is_left_endpoint_integer_shorter_interval<T>(exponent)) ++xi;

  // Try bigger divisor
  ret_value.significand = zi / 10;

  // If succeed, remove trailing zeros if necessary and return
  if (ret_value.significand * 10 >= xi) {
    ret_value.exponent = minus_k + 1;
    ret_value.exponent += remove_trailing_zeros(ret_value.significand);
    return ret_value;
  }

  // Otherwise, compute the round-up of y
  ret_value.significand =
      cache_accessor<T>::compute_round_up_for_shorter_interval_case(cache,
                                                                    beta);
  ret_value.exponent = minus_k;

  // When tie occurs, choose one of them according to the rule
  if (exponent >= float_info<T>::shorter_interval_tie_lower_threshold &&
      exponent <= float_info<T>::shorter_interval_tie_upper_threshold) {
    ret_value.significand = ret_value.significand % 2 == 0
                                ? ret_value.significand
                                : ret_value.significand - 1;
  } else if (ret_value.significand < xi) {
    ++ret_value.significand;
  }
  return ret_value;
}